

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDFOutlineObjectHelper::getDest(QPDFOutlineObjectHelper *this)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  QPDFObjectHandle *name;
  string *psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle dest;
  QPDFObjectHandle A;
  allocator<char> local_13c;
  allocator<char> local_13b;
  allocator<char> local_13a;
  allocator<char> local_139;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_138;
  string local_128;
  undefined1 local_108 [24];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_f0 [2];
  string local_d0;
  undefined1 local_b0 [32];
  QPDFObjectHandle local_90;
  QPDFObjectHandle local_80;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_70;
  allocator<char> local_60 [32];
  string local_40;
  
  local_138._M_ptr = (element_type *)0x0;
  local_138._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_108._0_8_ = (element_type *)0x0;
  local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 8);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_108 + 0x18),p_Var1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"/Dest",(allocator<char> *)&local_d0);
  bVar4 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)(local_108 + 0x18),&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0[0]._M_refcount);
  if (bVar4) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_d0,p_Var1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"/Dest",local_60);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_108 + 0x18),&local_d0);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_138,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_108 + 0x18)
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0[0]._M_refcount);
    std::__cxx11::string::~string((string *)&local_128);
    psVar2 = &local_d0;
LAB_0021fc3c:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar2->_M_string_length);
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_b0,p_Var1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"/A",&local_139);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_b0 + 0x10),(string *)local_b0);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_108,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 0x10));
    bVar4 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_108);
    if (!bVar4) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 0x18));
      std::__cxx11::string::~string((string *)&local_128);
      psVar2 = (string *)local_b0;
      goto LAB_0021fc3c;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_108 + 0x18),"/S",&local_13a)
    ;
    QPDFObjectHandle::getKey(&local_80,(string *)local_108);
    bVar4 = QPDFObjectHandle::isName(&local_80);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_60,"/S",&local_13b);
      QPDFObjectHandle::getKey(&local_90,(string *)local_108);
      QPDFObjectHandle::getName_abi_cxx11_(&local_d0,&local_90);
      bVar4 = std::operator==(&local_d0,"/GoTo");
      if (bVar4) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"/D",&local_13c);
        bVar4 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_108,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
      else {
        bVar4 = false;
      }
      std::__cxx11::string::~string((string *)&local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_90.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)local_60);
    }
    else {
      bVar4 = false;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_80.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)(local_108 + 0x18));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 0x18));
    std::__cxx11::string::~string((string *)&local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
    if (bVar4 != false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"/D",(allocator<char> *)&local_d0);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_108 + 0x18),(string *)local_108);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_138,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_108 + 0x18));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0[0]._M_refcount);
      std::__cxx11::string::~string((string *)&local_128);
    }
  }
  if (local_138._M_ptr == (element_type *)0x0) {
    QPDFObjectHandle::newNull();
    goto LAB_0021fcd9;
  }
  bVar4 = QPDFObjectHandle::isName((QPDFObjectHandle *)&local_138);
  if (bVar4) {
LAB_0021fc69:
    name = (QPDFObjectHandle *)**(undefined8 **)(in_RSI + 0x28);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_70,&local_138);
    QPDFOutlineDocumentHelper::resolveNamedDest((QPDFOutlineDocumentHelper *)&local_128,name);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_138,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_128);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  }
  else {
    bVar4 = QPDFObjectHandle::isString((QPDFObjectHandle *)&local_138);
    if (bVar4) goto LAB_0021fc69;
  }
  _Var3._M_pi = local_138._M_refcount._M_pi;
  local_138._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper = (_func_int **)local_138._M_ptr;
  (this->super_QPDFObjectHelper).super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var3._M_pi;
  local_138._M_ptr = (element_type *)0x0;
LAB_0021fcd9:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFOutlineObjectHelper::getDest()
{
    QPDFObjectHandle dest;
    QPDFObjectHandle A;
    if (oh().hasKey("/Dest")) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper direct dest");
        dest = oh().getKey("/Dest");
    } else if (
        (A = oh().getKey("/A")).isDictionary() && A.getKey("/S").isName() &&
        (A.getKey("/S").getName() == "/GoTo") && A.hasKey("/D")) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper action dest");
        dest = A.getKey("/D");
    }
    if (!dest) {
        return QPDFObjectHandle::newNull();
    }

    if (dest.isName() || dest.isString()) {
        QTC::TC("qpdf", "QPDFOutlineObjectHelper named dest");
        dest = m->dh.resolveNamedDest(dest);
    }

    return dest;
}